

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall embree::TutorialScene::print_camera_names(TutorialScene *this)

{
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  *in_RDI;
  size_t i;
  ulong local_18;
  
  sVar1 = std::
          vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          ::size(in_RDI);
  if (sVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"no cameras inside the scene");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_18 = 0;
    while( true ) {
      sVar1 = std::
              vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
              ::size(in_RDI);
      if (sVar1 <= local_18) break;
      poVar2 = std::operator<<((ostream *)&std::cout,"camera ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
      poVar2 = std::operator<<(poVar2,": ");
      pvVar3 = std::
               vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ::operator[](in_RDI,local_18);
      poVar2 = std::operator<<(poVar2,(string *)&(pvVar3->ptr->super_Node).name);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

void TutorialScene::print_camera_names ()
  {
    if (cameras.size() == 0) {
      std::cout << "no cameras inside the scene" << std::endl;
      return;
    }
    
    for (size_t i=0; i<cameras.size(); i++)
      std::cout << "camera " << i << ": " << cameras[i]->name << std::endl;
  }